

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesToArray
          (MessageGenerator *this,Printer *p)

{
  undefined1 *puVar1;
  Printer *pPVar2;
  long *plVar3;
  Options *in_RCX;
  long lVar4;
  long alStack_3c8 [4];
  undefined1 auStack_3a8 [8];
  Printer *local_3a0;
  byte *local_398;
  undefined8 local_390;
  byte local_388;
  undefined7 uStack_387;
  undefined8 uStack_380;
  undefined1 *local_378;
  long local_370;
  undefined1 local_368;
  undefined7 uStack_367;
  undefined8 uStack_360;
  undefined1 local_358 [32];
  string local_338;
  char *local_318;
  Sub local_310;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 local_230;
  code *local_228;
  code *local_220;
  undefined1 local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  undefined8 *local_180;
  undefined8 local_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  byte *local_e8;
  undefined8 local_e0;
  byte local_d8 [8];
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  alStack_3c8[3] = 0x25bd8c;
  local_3a0 = p;
  SimpleBaseClass_abi_cxx11_
            (&local_310.key_,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.key_._M_dataplus._M_p != &local_310.key_.field_2) {
    alStack_3c8[3] = 0x25bdb0;
    operator_delete(local_310.key_._M_dataplus._M_p,local_310.key_.field_2._M_allocated_capacity + 1
                   );
  }
  pPVar2 = local_3a0;
  if (local_310.key_._M_string_length == 0) {
    if ((this->descriptor_->options_->field_0)._impl_.message_set_wire_format_ == true) {
      alStack_3c8[3] = 0x25bde3;
      io::Printer::Emit(local_3a0,0,0,0x39e,
                        "\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n      $uint8$* $nonnull$ $classname$::_InternalSerialize(\n          const $pb$::MessageLite& base, $uint8$* $nonnull$ target,\n          $pb$::io::EpsCopyOutputStream* $nonnull$ stream) {\n        const $classname$& this_ = static_cast<const $classname$&>(base);\n#else   // PROTOBUF_CUSTOM_VTABLE\n      $uint8$* $nonnull$ $classname$::_InternalSerialize(\n          $uint8$* $nonnull$ target,\n          $pb$::io::EpsCopyOutputStream* $nonnull$ stream) const {\n        const $classname$& this_ = *this;\n#endif  // PROTOBUF_CUSTOM_VTABLE\n        $annotate_serialize$ target =\n            this_.$extensions$\n                .InternalSerializeMessageSetWithCachedSizesToArray(\n                    &default_instance(), target, stream);\n        target = ::_pbi::InternalSerializeUnknownMessageSetItemsToArray(\n            this_.$unknown_fields$, target, stream);\n        return target;\n      }\n    "
                       );
    }
    else {
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      alStack_3c8[3] = 0x25be0f;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"debug_cond","");
      local_318 = "1";
      alStack_3c8[3] = 0x25be34;
      io::Printer::Sub::Sub<char_const*>(&local_310,&local_338,&local_318);
      puVar1 = local_358 + 0x10;
      alStack_3c8[3] = 0x25be5d;
      local_358._0_8_ = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"ndebug","");
      local_258 = local_248;
      if ((undefined1 *)local_358._0_8_ == puVar1) {
        uStack_240 = local_358._24_8_;
      }
      else {
        local_258 = (undefined1 *)local_358._0_8_;
      }
      local_250 = local_358._8_8_;
      local_358._8_8_ = 0;
      local_358[0x10] = 0;
      alStack_3c8[3] = 0x25bec0;
      local_358._0_8_ = puVar1;
      local_238 = (undefined8 *)operator_new(0x18);
      *local_238 = this;
      local_238[1] = &local_3a0;
      *(undefined1 *)(local_238 + 2) = 0;
      local_220 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_230 = 0;
      local_228 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_218 = 1;
      local_210 = local_200;
      local_208 = 0;
      local_200[0] = 0;
      local_1f0 = 0;
      alStack_3c8[3] = 0x25bf36;
      std::__cxx11::string::_M_replace((ulong)&local_210,0,(char *)0x0,0x522f0c);
      local_1a8 = 0;
      alStack_3c8[3] = 0x25bf63;
      local_378 = &local_368;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"debug","");
      local_1a0 = local_190;
      if (local_378 == &local_368) {
        uStack_188 = uStack_360;
      }
      else {
        local_1a0 = local_378;
      }
      local_198 = local_370;
      local_370 = 0;
      local_368 = 0;
      alStack_3c8[3] = 0x25bfc6;
      local_378 = &local_368;
      local_180 = (undefined8 *)operator_new(0x18);
      *local_180 = this;
      local_180[1] = &local_3a0;
      *(undefined1 *)(local_180 + 2) = 0;
      local_168 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_178 = 0;
      local_170 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_160 = 1;
      local_158 = local_148;
      local_150 = 0;
      local_148[0] = 0;
      local_138 = 0;
      alStack_3c8[3] = 0x25c03c;
      std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x522f0c);
      local_f0 = 0;
      alStack_3c8[3] = 0x25c069;
      local_398 = &local_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"ifdef","");
      local_e8 = local_d8;
      if (local_398 == &local_388) {
        uStack_d0 = uStack_380;
      }
      else {
        local_e8 = local_398;
      }
      local_e0 = local_390;
      local_390 = 0;
      local_388 = 0;
      alStack_3c8[3] = 0x25c0d0;
      local_398 = &local_388;
      local_c8 = (undefined8 *)operator_new(0x18);
      *local_c8 = this;
      local_c8[1] = &local_3a0;
      *(undefined1 *)(local_c8 + 2) = 0;
      local_b0 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
      local_c0 = 0;
      local_b8 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
      local_a8 = 1;
      local_a0 = local_90;
      local_98 = 0;
      local_90[0] = 0;
      local_80 = 0;
      alStack_3c8[3] = 0x25c145;
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x522f0c);
      local_38 = 0;
      alStack_3c8[3] = 0x25c16d;
      io::Printer::Emit(pPVar2,&local_310,4,0x33c,
                        "\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n        $uint8$* $nonnull$ $classname$::_InternalSerialize(\n            const $pb$::MessageLite& base, $uint8$* $nonnull$ target,\n            $pb$::io::EpsCopyOutputStream* $nonnull$ stream) {\n          const $classname$& this_ = static_cast<const $classname$&>(base);\n#else   // PROTOBUF_CUSTOM_VTABLE\n        $uint8$* $nonnull$ $classname$::_InternalSerialize(\n            $uint8$* $nonnull$ target,\n            $pb$::io::EpsCopyOutputStream* $nonnull$ stream) const {\n          const $classname$& this_ = *this;\n#endif  // PROTOBUF_CUSTOM_VTABLE\n          $annotate_serialize$;\n          // @@protoc_insertion_point(serialize_to_array_start:$full_name$)\n          $ifdef$;\n          // @@protoc_insertion_point(serialize_to_array_end:$full_name$)\n          return target;\n        }\n      "
                       );
      lVar4 = 0x2e0;
      do {
        if (*(char *)((long)&local_318 + lVar4) == '\x01') {
          alStack_3c8[3] = 0x25c197;
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_358 + lVar4));
        }
        if ((long *)((long)&local_370 + lVar4) != *(long **)((long)&uStack_380 + lVar4)) {
          alStack_3c8[3] = 0x25c1b3;
          operator_delete(*(long **)((long)&uStack_380 + lVar4),
                          *(long *)((long)&local_370 + lVar4) + 1);
        }
        alStack_3c8[3] = 0x25c1c2;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(&local_388)[lVar4]]._M_data)
                  ((anon_class_1_0_00000001 *)(auStack_3a8 + 7),
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(auStack_3a8 + lVar4));
        plVar3 = (long *)((long)alStack_3c8 + lVar4 + 0x10);
        (&local_388)[lVar4] = 0xff;
        if (plVar3 != *(long **)((long)alStack_3c8 + lVar4)) {
          alStack_3c8[3] = 0x25c1e2;
          operator_delete(*(long **)((long)alStack_3c8 + lVar4),*plVar3 + 1);
        }
        lVar4 = lVar4 + -0xb8;
      } while (lVar4 != 0);
      if (local_398 != &local_388) {
        alStack_3c8[3] = 0x25c207;
        operator_delete(local_398,CONCAT71(uStack_387,local_388) + 1);
      }
      if (local_378 != &local_368) {
        alStack_3c8[3] = 0x25c223;
        operator_delete(local_378,CONCAT71(uStack_367,local_368) + 1);
      }
      if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
        alStack_3c8[3] = 0x25c23f;
        operator_delete((void *)local_358._0_8_,CONCAT71(local_358._17_7_,local_358[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        alStack_3c8[3] = 0x25c261;
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeWithCachedSizesToArray(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    p->Emit(R"cc(
#if defined(PROTOBUF_CUSTOM_VTABLE)
      $uint8$* $nonnull$ $classname$::_InternalSerialize(
          const $pb$::MessageLite& base, $uint8$* $nonnull$ target,
          $pb$::io::EpsCopyOutputStream* $nonnull$ stream) {
        const $classname$& this_ = static_cast<const $classname$&>(base);
#else   // PROTOBUF_CUSTOM_VTABLE
      $uint8$* $nonnull$ $classname$::_InternalSerialize(
          $uint8$* $nonnull$ target,
          $pb$::io::EpsCopyOutputStream* $nonnull$ stream) const {
        const $classname$& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
        $annotate_serialize$ target =
            this_.$extensions$
                .InternalSerializeMessageSetWithCachedSizesToArray(
                    &default_instance(), target, stream);
        target = ::_pbi::InternalSerializeUnknownMessageSetItemsToArray(
            this_.$unknown_fields$, target, stream);
        return target;
      }
    )cc");
    return;
  }

  p->Emit(
      {
          {"debug_cond", ShouldSerializeInOrder(descriptor_, options_)
                             ? "1"
                             : "defined(NDEBUG)"},
          {"ndebug", [&] { GenerateSerializeWithCachedSizesBody(p); }},
          {"debug", [&] { GenerateSerializeWithCachedSizesBodyShuffled(p); }},
          {"ifdef",
           [&] {
             if (ShouldSerializeInOrder(descriptor_, options_)) {
               p->Emit("$ndebug$");
             } else {
               p->Emit(R"cc(
#ifdef NDEBUG
                 $ndebug$;
#else   // NDEBUG
                 $debug$;
#endif  // !NDEBUG
               )cc");
             }
           }},
      },
      R"cc(
#if defined(PROTOBUF_CUSTOM_VTABLE)
        $uint8$* $nonnull$ $classname$::_InternalSerialize(
            const $pb$::MessageLite& base, $uint8$* $nonnull$ target,
            $pb$::io::EpsCopyOutputStream* $nonnull$ stream) {
          const $classname$& this_ = static_cast<const $classname$&>(base);
#else   // PROTOBUF_CUSTOM_VTABLE
        $uint8$* $nonnull$ $classname$::_InternalSerialize(
            $uint8$* $nonnull$ target,
            $pb$::io::EpsCopyOutputStream* $nonnull$ stream) const {
          const $classname$& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          $annotate_serialize$;
          // @@protoc_insertion_point(serialize_to_array_start:$full_name$)
          $ifdef$;
          // @@protoc_insertion_point(serialize_to_array_end:$full_name$)
          return target;
        }
      )cc");
}